

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

bool __thiscall
rapidjson::internal::Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Int
          (Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,int i)

{
  bool bVar1;
  Number n;
  U local_10;
  double local_8;
  
  local_10 = (U)(long)i;
  local_8 = (double)i;
  bVar1 = WriteNumber(this,(Number *)&local_10);
  return bVar1;
}

Assistant:

bool Int(int i) { Number n; n.u.i = i; n.d = static_cast<double>(i); return WriteNumber(n); }